

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O0

void ra_append_copies_after
               (roaring_array_t *ra,roaring_array_t *sa,uint16_t before_start,_Bool copy_on_write)

{
  undefined1 in_CL;
  undefined2 in_DX;
  undefined8 in_RSI;
  roaring_array_t *in_RDI;
  int start_location;
  undefined4 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffec;
  undefined1 copy_on_write_00;
  
  copy_on_write_00 = (undefined1)((ushort)in_DX >> 8);
  ra_get_index((roaring_array_t *)
               (CONCAT17(copy_on_write_00,
                         CONCAT16((char)in_DX,
                                  CONCAT15(in_CL,CONCAT14(in_stack_ffffffffffffffec,
                                                          in_stack_ffffffffffffffe8)))) &
               0xffff01ffffffffff),0);
  ra_append_copy_range
            ((roaring_array_t *)CONCAT26(before_start,CONCAT15(copy_on_write,_start_location)),
             in_RDI,(int32_t)((ulong)in_RSI >> 0x20),(int32_t)in_RSI,(_Bool)copy_on_write_00);
  return;
}

Assistant:

void ra_append_copies_after(roaring_array_t *ra, const roaring_array_t *sa,
                            uint16_t before_start, bool copy_on_write) {
    int start_location = ra_get_index(sa, before_start);
    if (start_location >= 0)
        ++start_location;
    else
        start_location = -start_location - 1;
    ra_append_copy_range(ra, sa, start_location, sa->size, copy_on_write);
}